

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

bool embree::avx512::InstanceArrayIntersector1::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  Geometry *pGVar2;
  RTCRayQueryContext *pRVar3;
  long *plVar4;
  long lVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  ulong uVar15;
  long lVar16;
  _func_int *p_Var17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined4 uVar26;
  vfloat4 a0_2;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_ZMM0 [64];
  vfloat4 a0;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_ZMM2 [64];
  int iVar35;
  vfloat4 a0_1;
  undefined1 auVar36 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_ZMM4 [64];
  vfloat4 b0;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar56;
  float fVar57;
  vfloat4 a1;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  RayQueryContext newcontext;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  auVar22 = in_ZMM4._0_16_;
  a0.field_0 = in_ZMM1._0_16_;
  a0_1.field_0 = in_ZMM3._0_16_;
  auVar21 = in_ZMM2._0_16_;
  a0_2.field_0 = in_ZMM0._0_16_;
  uVar1 = prim->primID_;
  pGVar2 = (context->scene->geometries).items[prim->instID_].ptr;
  if ((((*(long *)&pGVar2->field_0x58 == 0) &&
       ((uVar15 = (ulong)*(uint *)(*(long *)&pGVar2[1].time_range.upper +
                                  (long)pGVar2[1].intersectionFilterN * (ulong)uVar1),
        uVar15 == 0xffffffff ||
        (pGVar2[1].super_RefCount._vptr_RefCount[uVar15] == (_func_int *)0x0)))) ||
      ((ray->mask & pGVar2->mask) == 0)) ||
     (pRVar3 = context->user, pRVar3->instID[0] != 0xffffffff)) {
    bVar14 = false;
  }
  else {
    pRVar3->instID[0] = prim->instID_;
    pRVar3->instPrimID[0] = uVar1;
    uVar15 = (ulong)prim->primID_;
    plVar4 = *(long **)&pGVar2[1].fnumTimeSegments;
    iVar35 = (int)plVar4[4];
    if ((pGVar2->field_8).field_0x1 == '\x01') {
      if (iVar35 == 0x9134) {
        lVar5 = *plVar4;
        lVar16 = plVar4[2] * uVar15;
        auVar21 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + lVar16)),
                                ZEXT416(*(uint *)(lVar5 + 0x10 + lVar16)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar21,ZEXT416(*(uint *)(lVar5 + 0x20 + lVar16)),0x28);
        auVar21 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 4 + lVar16)),
                                ZEXT416(*(uint *)(lVar5 + 0x14 + lVar16)),0x1c);
        auVar22 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(lVar5 + 0x24 + lVar16)),0x28);
        auVar21 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 8 + lVar16)),
                                ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar21,ZEXT416(*(uint *)(lVar5 + 0x28 + lVar16)),0x28);
        auVar21 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),
                                ZEXT416(*(uint *)(lVar5 + 0x1c + lVar16)),0x1c);
        auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(lVar5 + 0x2c + lVar16)),0x28);
      }
      else if (iVar35 == 0x9234) {
        lVar5 = *plVar4;
        lVar16 = plVar4[2] * uVar15;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *(ulong *)(lVar5 + 4 + lVar16);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar16);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + lVar16)),_DAT_01fefe80,auVar22);
        auVar22 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),_DAT_01fefe80,auVar20)
        ;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar16);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16)),_DAT_01fefe80,
                                          auVar18);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)(lVar5 + 0x28 + lVar16);
        auVar21 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0x24 + lVar16)),_DAT_01fefe80,auVar19
                                    );
      }
      else if (iVar35 == 0xb001) {
        lVar5 = *plVar4;
        lVar16 = plVar4[2] * uVar15;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar16);
        auVar22 = vinsertps_avx(auVar25,ZEXT416(*(uint *)(lVar5 + 8 + lVar16)),0x20);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)(lVar5 + 0x34 + lVar16);
        auVar18 = vpermt2ps_avx512vl(auVar30,_DAT_01fefe90,ZEXT416(*(uint *)(lVar5 + lVar16)));
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar16);
        fVar52 = *(float *)(lVar5 + 0x24 + lVar16);
        fVar56 = *(float *)(lVar5 + 0x28 + lVar16);
        fVar57 = *(float *)(lVar5 + 0x2c + lVar16);
        auVar19 = vpermt2ps_avx512vl(auVar44,_DAT_01fefe90,ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16))
                                    );
        fVar58 = *(float *)(lVar5 + 0x30 + lVar16);
        auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar56 * fVar56)),ZEXT416((uint)fVar52),
                                  ZEXT416((uint)fVar52));
        auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar57),ZEXT416((uint)fVar57));
        auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar58),ZEXT416((uint)fVar58));
        auVar20 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar21._0_4_));
        fVar45 = auVar20._0_4_;
        fVar45 = fVar45 * 1.5 + fVar45 * fVar45 * fVar45 * auVar21._0_4_ * -0.5;
        auVar21 = vinsertps_avx(auVar19,ZEXT416((uint)(fVar45 * fVar52)),0x30);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar18,ZEXT416((uint)(fVar45 * fVar56)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar22,ZEXT416((uint)(fVar45 * fVar58)),0x30);
        auVar22 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),
                                ZEXT416(*(uint *)(lVar5 + 4 + lVar16)),0x10);
        auVar22 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(lVar5 + 0x3c + lVar16)),0x20);
        auVar22 = vinsertps_avx(auVar22,ZEXT416((uint)(fVar57 * fVar45)),0x30);
      }
      else if (iVar35 == 0x9244) {
        lVar5 = *plVar4;
        lVar16 = plVar4[2] * uVar15;
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + lVar16))->v;
        auVar22 = *(undefined1 (*) [16])(lVar5 + 0x10 + lVar16);
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x20 + lVar16))->
                        v;
        auVar21 = *(undefined1 (*) [16])(lVar5 + 0x30 + lVar16);
      }
      auVar19 = vshufps_avx(auVar21,auVar21,0xff);
      auVar20 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
      auVar25 = vshufps_avx(auVar22,auVar22,0xff);
      auVar30 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
      auVar18 = vshufps_avx((undefined1  [16])a0.field_0,ZEXT816(0) << 0x40,0xe9);
      auVar18 = vblendps_avx(auVar18,auVar22,4);
      fVar49 = auVar20._0_4_;
      auVar44 = vfmadd213ss_fma(auVar19,auVar19,ZEXT416((uint)(fVar49 * fVar49)));
      auVar44 = vfnmadd231ss_fma(auVar44,auVar25,auVar25);
      auVar31 = vfnmadd231ss_fma(auVar44,auVar30,auVar30);
      fVar45 = auVar19._0_4_;
      auVar23 = ZEXT416((uint)(auVar30._0_4_ * fVar45));
      auVar44 = vfmadd213ss_fma(auVar25,auVar20,auVar23);
      fVar52 = auVar44._0_4_ + auVar44._0_4_;
      auVar39 = ZEXT416((uint)(auVar25._0_4_ * fVar45));
      auVar44 = vfmsub213ss_fma(auVar30,auVar20,auVar39);
      fVar56 = auVar44._0_4_ + auVar44._0_4_;
      auVar44 = vfmsub231ss_fma(auVar23,auVar20,auVar25);
      fVar57 = auVar44._0_4_ + auVar44._0_4_;
      auVar44 = vfmsub231ss_fma(ZEXT416((uint)(fVar49 * fVar49)),auVar19,auVar19);
      auVar19 = vfmadd213ss_avx512f(auVar25,auVar25,auVar44);
      auVar23 = vfnmadd231ss_avx512f(auVar19,auVar30,auVar30);
      auVar19 = vfmadd213ss_avx512f(auVar30,auVar25,ZEXT416((uint)(fVar49 * fVar45)));
      auVar24 = vaddss_avx512f(auVar19,auVar19);
      auVar19 = vfmadd213ss_fma(auVar20,auVar30,auVar39);
      fVar58 = auVar19._0_4_ + auVar19._0_4_;
      auVar19 = vfmsub231ss_fma(ZEXT416((uint)(fVar49 * fVar45)),auVar25,auVar30);
      fVar45 = auVar19._0_4_ + auVar19._0_4_;
      auVar19 = vfnmadd231ss_fma(auVar44,auVar25,auVar25);
      auVar30 = vfmadd231ss_fma(auVar19,auVar30,auVar30);
      uVar26 = auVar31._0_4_;
      auVar53._4_4_ = uVar26;
      auVar53._0_4_ = uVar26;
      auVar53._8_4_ = uVar26;
      auVar53._12_4_ = uVar26;
      auVar59._4_4_ = fVar52;
      auVar59._0_4_ = fVar52;
      auVar59._8_4_ = fVar52;
      auVar59._12_4_ = fVar52;
      auVar61._0_4_ = fVar56 * 0.0;
      auVar61._4_4_ = fVar56 * 0.0;
      auVar61._8_4_ = fVar56 * 1.0;
      auVar61._12_4_ = fVar56 * 0.0;
      auVar44 = ZEXT816(0x3f80000000000000);
      auVar19 = vfmadd231ps_fma(auVar61,auVar44,auVar59);
      auVar31 = SUB6416(ZEXT464(0x3f800000),0);
      auVar20 = vfmadd231ps_fma(auVar19,auVar31,auVar53);
      auVar54._4_4_ = fVar57;
      auVar54._0_4_ = fVar57;
      auVar54._8_4_ = fVar57;
      auVar54._12_4_ = fVar57;
      auVar19 = vbroadcastss_avx512vl(auVar23);
      auVar25 = vbroadcastss_avx512vl(auVar24);
      auVar60._0_4_ = auVar25._0_4_ * 0.0;
      auVar60._4_4_ = auVar25._4_4_ * 0.0;
      auVar60._8_4_ = auVar25._8_4_ * 1.0;
      auVar60._12_4_ = auVar25._12_4_ * 0.0;
      auVar19 = vfmadd231ps_fma(auVar60,auVar44,auVar19);
      auVar25 = vfmadd231ps_fma(auVar19,auVar31,auVar54);
      auVar50._4_4_ = fVar58;
      auVar50._0_4_ = fVar58;
      auVar50._8_4_ = fVar58;
      auVar50._12_4_ = fVar58;
      auVar47._4_4_ = fVar45;
      auVar47._0_4_ = fVar45;
      auVar47._8_4_ = fVar45;
      auVar47._12_4_ = fVar45;
      fVar52 = auVar30._0_4_;
      auVar55._0_4_ = fVar52 * 0.0;
      auVar55._4_4_ = fVar52 * 0.0;
      auVar55._8_4_ = fVar52 * 1.0;
      auVar55._12_4_ = fVar52 * 0.0;
      auVar19 = vfmadd231ps_fma(auVar55,auVar44,auVar47);
      auVar19 = vfmadd231ps_fma(auVar19,auVar31,auVar50);
      auVar31._0_4_ = a0.field_0._0_4_;
      auVar31._4_4_ = auVar31._0_4_;
      auVar31._8_4_ = auVar31._0_4_;
      auVar31._12_4_ = auVar31._0_4_;
      fVar52 = auVar19._0_4_;
      auVar48._0_4_ = fVar52 * 0.0;
      fVar56 = auVar19._4_4_;
      auVar48._4_4_ = fVar56 * 0.0;
      fVar57 = auVar19._8_4_;
      auVar48._8_4_ = fVar57 * 0.0;
      fVar58 = auVar19._12_4_;
      auVar48._12_4_ = fVar58 * 0.0;
      auVar19 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar25,auVar48);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar19,auVar20,auVar31);
      uVar26 = auVar22._0_4_;
      auVar51._4_4_ = uVar26;
      auVar51._0_4_ = uVar26;
      auVar51._8_4_ = uVar26;
      auVar51._12_4_ = uVar26;
      auVar22 = vshufps_avx(auVar22,auVar22,0x55);
      auVar22 = vfmadd213ps_fma(auVar22,auVar25,auVar48);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd231ps_fma(auVar22,auVar20,auVar51);
      iVar35 = a0_1.field_0._0_4_;
      auVar39._4_4_ = iVar35;
      auVar39._0_4_ = iVar35;
      auVar39._8_4_ = iVar35;
      auVar39._12_4_ = iVar35;
      auVar22 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
      auVar19 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
      auVar24._0_4_ = fVar52 * auVar19._0_4_;
      auVar24._4_4_ = fVar56 * auVar19._4_4_;
      auVar24._8_4_ = fVar57 * auVar19._8_4_;
      auVar24._12_4_ = fVar58 * auVar19._12_4_;
      auVar22 = vfmadd231ps_fma(auVar24,auVar25,auVar22);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar22,auVar20,auVar39);
      uVar26 = auVar21._0_4_;
      auVar40._4_4_ = uVar26;
      auVar40._0_4_ = uVar26;
      auVar40._8_4_ = uVar26;
      auVar40._12_4_ = uVar26;
      auVar22 = vshufps_avx(auVar21,auVar21,0x55);
      auVar21 = vshufps_avx(auVar21,auVar21,0xaa);
      auVar23._0_4_ = fVar52 * auVar21._0_4_;
      auVar23._4_4_ = fVar56 * auVar21._4_4_;
      auVar23._8_4_ = fVar57 * auVar21._8_4_;
      auVar23._12_4_ = fVar58 * auVar21._12_4_;
      auVar21 = vfmadd231ps_fma(auVar23,auVar25,auVar22);
      auVar22 = vfmadd231ps_fma(auVar21,auVar20,auVar40);
      auVar21._0_4_ = auVar18._0_4_ + 0.0 + auVar22._0_4_;
      auVar21._4_4_ = auVar18._4_4_ + 0.0 + auVar22._4_4_;
      auVar21._8_4_ = auVar18._8_4_ + 0.0 + auVar22._8_4_;
      auVar21._12_4_ = auVar18._12_4_ + 0.0 + auVar22._12_4_;
    }
    else if (iVar35 == 0x9134) {
      lVar5 = *plVar4;
      lVar16 = plVar4[2] * uVar15;
      auVar21 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + lVar16)),
                              ZEXT416(*(uint *)(lVar5 + 0x10 + lVar16)),0x1c);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar21,ZEXT416(*(uint *)(lVar5 + 0x20 + lVar16)),0x28);
      auVar21 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 4 + lVar16)),
                              ZEXT416(*(uint *)(lVar5 + 0x14 + lVar16)),0x1c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar21,ZEXT416(*(uint *)(lVar5 + 0x24 + lVar16)),0x28);
      auVar21 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 8 + lVar16)),
                              ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16)),0x1c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar21,ZEXT416(*(uint *)(lVar5 + 0x28 + lVar16)),0x28);
      auVar21 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),
                              ZEXT416(*(uint *)(lVar5 + 0x1c + lVar16)),0x1c);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(lVar5 + 0x2c + lVar16)),0x28);
    }
    else if (iVar35 == 0x9234) {
      lVar5 = *plVar4;
      lVar16 = plVar4[2] * uVar15;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)(lVar5 + 4 + lVar16);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar16);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + lVar16)),_DAT_01fefe80,auVar32);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),_DAT_01fefe80,auVar36
                                     );
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar16);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16)),_DAT_01fefe80,
                                        auVar33);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = *(ulong *)(lVar5 + 0x28 + lVar16);
      auVar21 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar5 + 0x24 + lVar16)),_DAT_01fefe80,auVar41);
    }
    else if (iVar35 == 0xb001) {
      lVar5 = *plVar4;
      lVar16 = plVar4[2] * uVar15;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar16);
      auVar22 = vinsertps_avx(auVar27,ZEXT416(*(uint *)(lVar5 + 8 + lVar16)),0x20);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)(lVar5 + 0x34 + lVar16);
      auVar18 = vpermt2ps_avx512vl(auVar28,_DAT_01fefe90,ZEXT416(*(uint *)(lVar5 + lVar16)));
      auVar42._8_8_ = 0;
      auVar42._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar16);
      fVar52 = *(float *)(lVar5 + 0x24 + lVar16);
      fVar56 = *(float *)(lVar5 + 0x28 + lVar16);
      fVar57 = *(float *)(lVar5 + 0x2c + lVar16);
      auVar19 = vpermt2ps_avx512vl(auVar42,_DAT_01fefe90,ZEXT416(*(uint *)(lVar5 + 0x18 + lVar16)));
      fVar58 = *(float *)(lVar5 + 0x30 + lVar16);
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar56 * fVar56)),ZEXT416((uint)fVar52),
                                ZEXT416((uint)fVar52));
      auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar57),ZEXT416((uint)fVar57));
      auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar58),ZEXT416((uint)fVar58));
      auVar20 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar21._0_4_));
      fVar45 = auVar20._0_4_;
      fVar45 = fVar45 * 1.5 + fVar45 * fVar45 * fVar45 * auVar21._0_4_ * -0.5;
      auVar21 = vinsertps_avx(auVar19,ZEXT416((uint)(fVar45 * fVar52)),0x30);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar18,ZEXT416((uint)(fVar45 * fVar56)),0x30);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar22,ZEXT416((uint)(fVar45 * fVar58)),0x30);
      auVar22 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),
                              ZEXT416(*(uint *)(lVar5 + 4 + lVar16)),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(lVar5 + 0x3c + lVar16)),0x20);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar22,ZEXT416((uint)(fVar57 * fVar45)),0x30);
    }
    else if (iVar35 == 0x9244) {
      lVar5 = *plVar4;
      lVar16 = plVar4[2] * uVar15;
      a0_2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + lVar16))->v;
      a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x10 + lVar16))->v;
      a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x20 + lVar16))->v;
      auVar21 = *(undefined1 (*) [16])(lVar5 + 0x30 + lVar16);
    }
    auVar22 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
    auVar18 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
    auVar46._0_4_ = a0_1.field_0._0_4_ * auVar18._0_4_;
    auVar46._4_4_ = a0_1.field_0._4_4_ * auVar18._4_4_;
    auVar46._8_4_ = a0_1.field_0._8_4_ * auVar18._8_4_;
    auVar46._12_4_ = a0_1.field_0._12_4_ * auVar18._12_4_;
    auVar25 = vfmsub231ps_fma(auVar46,(undefined1  [16])a0.field_0,auVar22);
    auVar19 = vshufps_avx(auVar25,auVar25,0xc9);
    auVar20 = vshufps_avx((undefined1  [16])a0_2.field_0,(undefined1  [16])a0_2.field_0,0xc9);
    auVar37._0_4_ = a0_2.field_0._0_4_ * auVar22._0_4_;
    auVar37._4_4_ = a0_2.field_0._4_4_ * auVar22._4_4_;
    auVar37._8_4_ = a0_2.field_0._8_4_ * auVar22._8_4_;
    auVar37._12_4_ = a0_2.field_0._12_4_ * auVar22._12_4_;
    auVar30 = vfmsub231ps_fma(auVar37,auVar20,(undefined1  [16])a0_1.field_0);
    auVar29._0_4_ = auVar20._0_4_ * a0.field_0._0_4_;
    auVar29._4_4_ = auVar20._4_4_ * a0.field_0._4_4_;
    auVar29._8_4_ = auVar20._8_4_ * a0.field_0._8_4_;
    auVar29._12_4_ = auVar20._12_4_ * a0.field_0._12_4_;
    auVar20 = vfmsub231ps_fma(auVar29,(undefined1  [16])a0_2.field_0,auVar18);
    auVar22 = vshufps_avx(auVar20,auVar20,0xc9);
    auVar18 = vunpcklps_avx(auVar19,auVar22);
    auVar20 = vunpcklps_avx(auVar25,auVar20);
    auVar22 = vinsertps_avx(auVar30,auVar30,0x4a);
    auVar20 = vunpcklps_avx(auVar20,ZEXT416(auVar30._0_4_));
    auVar25 = vunpcklps_avx(auVar18,auVar22);
    auVar18 = vunpckhps_avx(auVar18,auVar22);
    auVar22 = vdpps_avx((undefined1  [16])a0_2.field_0,auVar19,0x7f);
    uVar26 = auVar22._0_4_;
    auVar43._4_4_ = uVar26;
    auVar43._0_4_ = uVar26;
    auVar43._8_4_ = uVar26;
    auVar43._12_4_ = uVar26;
    auVar22 = vdivps_avx(auVar25,auVar43);
    auVar18 = vdivps_avx(auVar18,auVar43);
    auVar19 = vdivps_avx(auVar20,auVar43);
    uVar26 = auVar21._0_4_;
    auVar38._4_4_ = uVar26;
    auVar38._0_4_ = uVar26;
    auVar38._8_4_ = uVar26;
    auVar38._12_4_ = uVar26;
    auVar20 = vshufps_avx(auVar21,auVar21,0x55);
    auVar21 = vshufps_avx(auVar21,auVar21,0xaa);
    auVar34._0_4_ = auVar21._0_4_ * auVar19._0_4_;
    auVar34._4_4_ = auVar21._4_4_ * auVar19._4_4_;
    auVar34._8_4_ = auVar21._8_4_ * auVar19._8_4_;
    auVar34._12_4_ = auVar21._12_4_ * auVar19._12_4_;
    auVar21 = vfmadd231ps_fma(auVar34,auVar18,auVar20);
    auVar21 = vfmadd231ps_fma(auVar21,auVar22,auVar38);
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar21 = vxorps_avx512vl(auVar21,auVar7);
    p_Var17 = *(_func_int **)&pGVar2->field_0x58;
    if (p_Var17 == (_func_int *)0x0) {
      p_Var17 = pGVar2[1].super_RefCount._vptr_RefCount
                [*(uint *)(*(long *)&pGVar2[1].time_range.upper +
                          uVar15 * (long)pGVar2[1].intersectionFilterN)];
    }
    auVar20 = *(undefined1 (*) [16])(ray->org).field_0.m128;
    auVar25 = *(undefined1 (*) [16])(ray->dir).field_0.m128;
    uVar26 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
    auVar8._4_4_ = uVar26;
    auVar8._0_4_ = uVar26;
    auVar8._8_4_ = uVar26;
    auVar8._12_4_ = uVar26;
    auVar21 = vfmadd231ps_avx512vl(auVar21,auVar19,auVar8);
    uVar26 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
    auVar9._4_4_ = uVar26;
    auVar9._0_4_ = uVar26;
    auVar9._8_4_ = uVar26;
    auVar9._12_4_ = uVar26;
    auVar21 = vfmadd231ps_avx512vl(auVar21,auVar18,auVar9);
    uVar26 = *(undefined4 *)&(ray->org).field_0;
    auVar10._4_4_ = uVar26;
    auVar10._0_4_ = uVar26;
    auVar10._8_4_ = uVar26;
    auVar10._12_4_ = uVar26;
    auVar21 = vfmadd231ps_avx512vl(auVar21,auVar22,auVar10);
    aVar6 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar21,auVar20,8);
    (ray->org).field_0 = aVar6;
    uVar26 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
    auVar11._4_4_ = uVar26;
    auVar11._0_4_ = uVar26;
    auVar11._8_4_ = uVar26;
    auVar11._12_4_ = uVar26;
    auVar21 = vmulps_avx512vl(auVar19,auVar11);
    uVar26 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
    auVar12._4_4_ = uVar26;
    auVar12._0_4_ = uVar26;
    auVar12._8_4_ = uVar26;
    auVar12._12_4_ = uVar26;
    auVar21 = vfmadd231ps_avx512vl(auVar21,auVar18,auVar12);
    uVar26 = *(undefined4 *)&(ray->dir).field_0;
    auVar13._4_4_ = uVar26;
    auVar13._0_4_ = uVar26;
    auVar13._8_4_ = uVar26;
    auVar13._12_4_ = uVar26;
    auVar21 = vfmadd231ps_avx512vl(auVar21,auVar22,auVar13);
    aVar6 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar21,auVar25,8);
    (ray->dir).field_0 = aVar6;
    (**(code **)(p_Var17 + 0x80))(p_Var17 + 0x58,ray);
    local_38 = auVar20._0_8_;
    uStack_30 = auVar20._8_8_;
    *(undefined8 *)&(ray->org).field_0 = local_38;
    *(undefined8 *)((long)&(ray->org).field_0 + 8) = uStack_30;
    local_48 = auVar25._0_8_;
    uStack_40 = auVar25._8_8_;
    *(undefined8 *)&(ray->dir).field_0 = local_48;
    *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uStack_40;
    bVar14 = ray->tfar < 0.0;
    pRVar3->instID[0] = 0xffffffff;
    pRVar3->instPrimID[0] = 0xffffffff;
  }
  return bVar14;
}

Assistant:

bool InstanceArrayIntersector1::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_);
        Accel* object = instance->getObject(prim.primID_);
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;
    }